

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void * build_ir_internal(Context_conflict *ctx,void *_ast)

{
  int iVar1;
  MOJOSHADER_astDataTypeType MVar2;
  int iVar3;
  int iVar4;
  MOJOSHADER_irExpression *tval;
  MOJOSHADER_irExpression *fval;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar5;
  MOJOSHADER_irExpression *pMVar6;
  undefined4 *puVar7;
  MOJOSHADER_irExpression *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *next;
  MOJOSHADER_irBinOpType MVar10;
  int iVar11;
  MOJOSHADER_irConditionType operation;
  MOJOSHADER_astVariableDeclaration *_ast_00;
  
  iVar11 = 0x159430;
LAB_00145615:
  if ((MOJOSHADER_astForStatement *)_ast == (MOJOSHADER_astForStatement *)0x0) {
    return (void *)0x0;
  }
  if (ctx->out_of_memory != 0) {
    return (void *)0x0;
  }
  ctx->sourcefile = (((MOJOSHADER_astForStatement *)_ast)->ast).filename;
  ctx->sourceline = (((MOJOSHADER_astForStatement *)_ast)->ast).line;
  switch((((MOJOSHADER_astForStatement *)_ast)->ast).type) {
  case MOJOSHADER_AST_OP_PREINCREMENT:
    MVar10 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_00145c45;
  case MOJOSHADER_AST_OP_PREDECREMENT:
    MVar10 = MOJOSHADER_IR_BINOP_SUBTRACT;
LAB_00145c45:
    pMVar6 = build_ir_preincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,MVar10);
    return pMVar6;
  case MOJOSHADER_AST_OP_NEGATE:
    pMVar6 = build_ir_increxpr(ctx,(MOJOSHADER_astDataType *)
                                   ((MOJOSHADER_astForStatement *)_ast)->next,-1);
    _ast_00 = *(MOJOSHADER_astVariableDeclaration **)&((MOJOSHADER_astForStatement *)_ast)->unroll;
    goto LAB_00145c9f;
  case MOJOSHADER_AST_OP_COMPLEMENT:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    iVar11 = -1;
    goto LAB_00145b77;
  case MOJOSHADER_AST_OP_NOT:
    if (**(int **)((long)*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll + 0x18) != 1) {
      __assert_fail("ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x155b,"void *build_ir_internal(Context *, void *)");
    }
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    iVar11 = 1;
LAB_00145b77:
    pMVar8 = new_ir_constint(ctx,iVar11);
    MVar10 = MOJOSHADER_IR_BINOP_XOR;
    break;
  case MOJOSHADER_AST_OP_POSTINCREMENT:
    MVar10 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_0014597b;
  case MOJOSHADER_AST_OP_POSTDECREMENT:
    MVar10 = MOJOSHADER_IR_BINOP_SUBTRACT;
LAB_0014597b:
    pMVar6 = build_ir_postincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,MVar10);
    return pMVar6;
  case MOJOSHADER_AST_OP_CAST:
    pMVar6 = build_ir_convert(ctx,(MOJOSHADER_astExpressionCast *)_ast);
    return pMVar6;
  default:
    __assert_fail("0 && \"unexpected type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1607,"void *build_ir_internal(Context *, void *)");
  case MOJOSHADER_AST_OP_COMMA:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar9 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar9->ir).type = MOJOSHADER_IR_EXPR_STMT;
      (pMVar9->ir).filename = ctx->sourcefile;
      (pMVar9->ir).line = ctx->sourceline;
      (pMVar9->move).dst = pMVar6;
    }
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    pMVar6 = new_ir_eseq(ctx,pMVar9,pMVar6);
    return pMVar6;
  case MOJOSHADER_AST_OP_MULTIPLY:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_MULTIPLY;
    break;
  case MOJOSHADER_AST_OP_DIVIDE:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_DIVIDE;
    break;
  case MOJOSHADER_AST_OP_MODULO:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_MODULO;
    break;
  case MOJOSHADER_AST_OP_ADD:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_ADD;
    break;
  case MOJOSHADER_AST_OP_SUBTRACT:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    _ast_00 = ((MOJOSHADER_astForStatement *)_ast)->var_decl;
LAB_00145c9f:
    pMVar8 = build_ir_expr(ctx,_ast_00);
    MVar10 = MOJOSHADER_IR_BINOP_SUBTRACT;
    break;
  case MOJOSHADER_AST_OP_LSHIFT:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_LSHIFT;
    break;
  case MOJOSHADER_AST_OP_RSHIFT:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_RSHIFT;
    break;
  case MOJOSHADER_AST_OP_LESSTHAN:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_LT;
    goto LAB_00145c24;
  case MOJOSHADER_AST_OP_GREATERTHAN:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_GT;
    goto LAB_00145c24;
  case MOJOSHADER_AST_OP_LESSTHANOREQUAL:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_LEQ;
    goto LAB_00145c24;
  case MOJOSHADER_AST_OP_GREATERTHANOREQUAL:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_GEQ;
    goto LAB_00145c24;
  case MOJOSHADER_AST_OP_EQUAL:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_EQL;
    goto LAB_00145c24;
  case MOJOSHADER_AST_OP_NOTEQUAL:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_NEQ;
    goto LAB_00145c24;
  case MOJOSHADER_AST_OP_BINARYAND:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_AND;
    break;
  case MOJOSHADER_AST_OP_BINARYXOR:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_XOR;
    break;
  case MOJOSHADER_AST_OP_BINARYOR:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar10 = MOJOSHADER_IR_BINOP_OR;
    break;
  case MOJOSHADER_AST_OP_LOGICALAND:
    iVar11 = 1;
    goto LAB_00145cb9;
  case MOJOSHADER_AST_OP_LOGICALOR:
    iVar11 = 0;
LAB_00145cb9:
    pMVar6 = build_ir_logical_and_or(ctx,(MOJOSHADER_astExpressionBinary *)_ast,iVar11);
    return pMVar6;
  case MOJOSHADER_AST_OP_ASSIGN:
    pMVar6 = build_ir_assign(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_OP_MULASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_MULTIPLY;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_DIVASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_DIVIDE;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_MODASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_MODULO;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_ADDASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_SUBASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_SUBTRACT;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_LSHIFTASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_LSHIFT;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_RSHIFTASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_RSHIFT;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_ANDASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_AND;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_XORASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_XOR;
    goto LAB_00145d10;
  case MOJOSHADER_AST_OP_ORASSIGN:
    MVar10 = MOJOSHADER_IR_BINOP_OR;
LAB_00145d10:
    pMVar6 = build_ir_assign_binop(ctx,MVar10,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_OP_DEREF_ARRAY:
    pMVar6 = build_ir_derefarray(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_OP_CONDITIONAL:
    if (**(int **)((long)*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll + 0x18) != 1) {
      __assert_fail("ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1593,"void *build_ir_internal(Context *, void *)");
    }
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar8 = new_ir_constbool(ctx,1);
    tval = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    fval = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->initializer);
    operation = MOJOSHADER_IR_COND_EQL;
LAB_00145c24:
    pMVar6 = build_ir_compare(ctx,operation,pMVar6,pMVar8,tval,fval);
    return pMVar6;
  case MOJOSHADER_AST_OP_IDENTIFIER:
    pMVar6 = build_ir_identifier(ctx,(MOJOSHADER_astExpressionIdentifier *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_OP_INT_LITERAL:
    pMVar6 = new_ir_constint(ctx,((MOJOSHADER_astForStatement *)_ast)->unroll);
    return pMVar6;
  case MOJOSHADER_AST_OP_FLOAT_LITERAL:
    pMVar6 = new_ir_constfloat(ctx,(float)*(double *)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    return pMVar6;
  case MOJOSHADER_AST_OP_STRING_LITERAL:
  case MOJOSHADER_AST_COMPUNIT_FUNCTION:
  case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
  case MOJOSHADER_AST_COMPUNIT_STRUCT:
  case MOJOSHADER_AST_COMPUNIT_VARIABLE:
  case MOJOSHADER_AST_FUNCTION_PARAMS:
  case MOJOSHADER_AST_FUNCTION_SIGNATURE:
  case MOJOSHADER_AST_SCALAR_OR_ARRAY:
  case MOJOSHADER_AST_TYPEDEF:
  case MOJOSHADER_AST_PACK_OFFSET:
  case MOJOSHADER_AST_VARIABLE_LOWLEVEL:
  case MOJOSHADER_AST_ANNOTATION:
  case MOJOSHADER_AST_VARIABLE_DECLARATION:
  case MOJOSHADER_AST_STRUCT_DECLARATION:
  case MOJOSHADER_AST_STRUCT_MEMBER:
  case MOJOSHADER_AST_SWITCH_CASE:
  case MOJOSHADER_AST_ARGUMENTS:
    __assert_fail("0 && \"Shouldn\'t hit this in build_ir.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1603,"void *build_ir_internal(Context *, void *)");
  case MOJOSHADER_AST_OP_BOOLEAN_LITERAL:
    pMVar6 = new_ir_constbool(ctx,((MOJOSHADER_astForStatement *)_ast)->unroll);
    return pMVar6;
  case MOJOSHADER_AST_OP_DEREF_STRUCT:
    if (*(int *)&((MOJOSHADER_astForStatement *)_ast)->initializer == 0) {
      pMVar6 = build_ir_derefstruct(ctx,(MOJOSHADER_astExpressionDerefStruct *)_ast);
      return pMVar6;
    }
    pMVar6 = build_ir_swizzle(ctx,(MOJOSHADER_astExpressionDerefStruct *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_OP_CALLFUNC:
    pMVar6 = build_ir_call(ctx,(MOJOSHADER_astExpressionCallFunction *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_OP_CONSTRUCTOR:
    pMVar6 = build_ir_constructor(ctx,(MOJOSHADER_astExpressionConstructor *)_ast);
    return pMVar6;
  case MOJOSHADER_AST_STATEMENT_EMPTY:
  case MOJOSHADER_AST_STATEMENT_TYPEDEF:
  case MOJOSHADER_AST_STATEMENT_STRUCT:
  case MOJOSHADER_AST_STATEMENT_VARDECL:
    goto switchD_0014564d_caseD_43;
  case MOJOSHADER_AST_STATEMENT_BREAK:
    if (ctx->ir_loop == (LoopLabels *)0x0) {
      __assert_fail("labels != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15b2,"void *build_ir_internal(Context *, void *)");
    }
    iVar11 = ctx->ir_loop->end;
    goto LAB_00145e4e;
  case MOJOSHADER_AST_STATEMENT_CONTINUE:
    if (ctx->ir_loop == (LoopLabels *)0x0) {
      __assert_fail("labels != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15b9,"void *build_ir_internal(Context *, void *)");
    }
    iVar11 = ctx->ir_loop->start;
LAB_00145e4e:
    puVar7 = (undefined4 *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (puVar7 == (undefined4 *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      puVar7 = (undefined4 *)0x0;
    }
    else {
      *puVar7 = 0xf;
      *(char **)(puVar7 + 2) = ctx->sourcefile;
      puVar7[4] = ctx->sourceline;
      puVar7[6] = iVar11;
    }
    return puVar7;
  case MOJOSHADER_AST_STATEMENT_DISCARD:
    pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x18,ctx->malloc_data);
    if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
LAB_00145eca:
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar9 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar9->ir).type = MOJOSHADER_IR_DISCARD;
      (pMVar9->ir).filename = ctx->sourcefile;
      (pMVar9->ir).line = ctx->sourceline;
    }
    goto LAB_00145eda;
  case MOJOSHADER_AST_STATEMENT_BLOCK:
    pMVar9 = build_ir_stmt(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    goto LAB_00145eda;
  case MOJOSHADER_AST_STATEMENT_EXPRESSION:
    pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar9 == (MOJOSHADER_irStatement *)0x0) goto LAB_00145eca;
    (pMVar9->ir).type = MOJOSHADER_IR_EXPR_STMT;
    (pMVar9->ir).filename = ctx->sourcefile;
    (pMVar9->ir).line = ctx->sourceline;
    (pMVar9->move).dst = pMVar6;
LAB_00145eda:
    next = build_ir_stmt(ctx,((MOJOSHADER_astForStatement *)_ast)->next);
LAB_00145fd2:
    pMVar9 = new_ir_seq(ctx,pMVar9,next);
    return pMVar9;
  case MOJOSHADER_AST_STATEMENT_IF:
    pMVar9 = build_ir_ifstmt(ctx,(MOJOSHADER_astIfStatement *)_ast);
    return pMVar9;
  case MOJOSHADER_AST_STATEMENT_SWITCH:
    pMVar9 = build_ir_switch(ctx,(MOJOSHADER_astSwitchStatement *)_ast);
    return pMVar9;
  case MOJOSHADER_AST_STATEMENT_FOR:
    pMVar9 = build_ir_forstmt(ctx,(MOJOSHADER_astForStatement *)_ast);
    return pMVar9;
  case MOJOSHADER_AST_STATEMENT_DO:
    pMVar9 = build_ir_dostmt(ctx,(MOJOSHADER_astDoStatement *)_ast);
    return pMVar9;
  case MOJOSHADER_AST_STATEMENT_WHILE:
    pMVar9 = build_ir_whilestmt(ctx,(MOJOSHADER_astWhileStatement *)_ast);
    return pMVar9;
  case MOJOSHADER_AST_STATEMENT_RETURN:
    iVar1 = ctx->ir_end;
    if (iVar1 < 0) {
      __assert_fail("label >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15e4,"void *build_ir_internal(Context *, void *)");
    }
    if (*(long *)&((MOJOSHADER_astForStatement *)_ast)->unroll == 0) {
      pMVar9 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      dt = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                (*(long *)&((MOJOSHADER_astForStatement *)_ast)->unroll + 0x18));
      pMVar5 = datatype_base(ctx,dt);
      MVar2 = pMVar5->type;
      iVar4 = datatype_elems(ctx,dt);
      iVar3 = ctx->ir_ret;
      if (iVar3 < 0) {
        __assert_fail("ctx->ir_ret >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x15ec,"void *build_ir_internal(Context *, void *)");
      }
      pMVar6 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar6 == (MOJOSHADER_irExpression *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar6 = (MOJOSHADER_irExpression *)0x0;
      }
      else {
        (pMVar6->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar6->ir).filename = ctx->sourcefile;
        (pMVar6->ir).line = ctx->sourceline;
        (pMVar6->info).type = MVar2;
        (pMVar6->info).elements = iVar4;
        (pMVar6->temp).index = iVar3;
      }
      pMVar8 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
      pMVar9 = new_ir_move(ctx,pMVar6,pMVar8,iVar11);
    }
    next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (next == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      next = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (next->ir).type = MOJOSHADER_IR_JUMP;
      (next->ir).filename = ctx->sourcefile;
      (next->ir).line = ctx->sourceline;
      (next->jump).label = iVar1;
    }
    goto LAB_00145fd2;
  }
  pMVar6 = new_ir_binop(ctx,MVar10,pMVar6,pMVar8);
  return pMVar6;
switchD_0014564d_caseD_43:
  _ast = ((MOJOSHADER_astForStatement *)_ast)->next;
  goto LAB_00145615;
}

Assistant:

static void *build_ir_internal(Context *ctx, void *_ast)
{
    if ((_ast == NULL) || (ctx->out_of_memory))
        return NULL;

    MOJOSHADER_astNode *ast = (MOJOSHADER_astNode *) _ast;

    // upkeep so we report correct error locations...
    ctx->sourcefile = ast->ast.filename;
    ctx->sourceline = ast->ast.line;

    switch (ast->ast.type)
    {
        case MOJOSHADER_AST_OP_PREINCREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_POSTINCREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_PREDECREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_POSTDECREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_COMPLEMENT:
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 0xFFFFFFFF));

        case MOJOSHADER_AST_OP_NEGATE:  // !!! FIXME: -0.0f != +0.0f
            return NEW_IR_BINOP(SUBTRACT, build_ir_increxpr(ctx, ast->unary.datatype, -1),
                                build_ir_expr(ctx, ast->unary.operand));

        case MOJOSHADER_AST_OP_NOT:  // operand must be bool here!
            assert(ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 1));

        case MOJOSHADER_AST_OP_DEREF_ARRAY:
            return build_ir_derefarray(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_DEREF_STRUCT:
            if (ast->derefstruct.isswizzle)
                return build_ir_swizzle(ctx, &ast->derefstruct);
            return build_ir_derefstruct(ctx, &ast->derefstruct);

        case MOJOSHADER_AST_OP_COMMA:
            // evaluate and throw away left, return right.
            return new_ir_eseq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->binary.left)),
                               build_ir_expr(ctx, ast->binary.right));

        case MOJOSHADER_AST_OP_LESSTHAN: return EASY_IR_COMPARE(LT);
        case MOJOSHADER_AST_OP_GREATERTHAN: return EASY_IR_COMPARE(GT);
        case MOJOSHADER_AST_OP_LESSTHANOREQUAL: return EASY_IR_COMPARE(LEQ);
        case MOJOSHADER_AST_OP_GREATERTHANOREQUAL: return EASY_IR_COMPARE(GEQ);
        case MOJOSHADER_AST_OP_NOTEQUAL: return EASY_IR_COMPARE(NEQ);
        case MOJOSHADER_AST_OP_EQUAL: return EASY_IR_COMPARE(EQL);

        case MOJOSHADER_AST_OP_MULTIPLY: return EASY_IR_BINOP(MULTIPLY);
        case MOJOSHADER_AST_OP_DIVIDE: return EASY_IR_BINOP(DIVIDE);
        case MOJOSHADER_AST_OP_MODULO: return EASY_IR_BINOP(MODULO);
        case MOJOSHADER_AST_OP_ADD: return EASY_IR_BINOP(ADD);
        case MOJOSHADER_AST_OP_SUBTRACT: return EASY_IR_BINOP(SUBTRACT);
        case MOJOSHADER_AST_OP_LSHIFT: return EASY_IR_BINOP(LSHIFT);
        case MOJOSHADER_AST_OP_RSHIFT: return EASY_IR_BINOP(RSHIFT);
        case MOJOSHADER_AST_OP_BINARYAND: return EASY_IR_BINOP(AND);
        case MOJOSHADER_AST_OP_BINARYXOR: return EASY_IR_BINOP(XOR);
        case MOJOSHADER_AST_OP_BINARYOR: return EASY_IR_BINOP(OR);

        case MOJOSHADER_AST_OP_LOGICALAND:
            return build_ir_logical_and(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_LOGICALOR:
            return build_ir_logical_or(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_ASSIGN:
            return build_ir_assign(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_MULASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MULTIPLY, &ast->binary);
        case MOJOSHADER_AST_OP_DIVASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_DIVIDE, &ast->binary);
        case MOJOSHADER_AST_OP_MODASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MODULO, &ast->binary);
        case MOJOSHADER_AST_OP_ADDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_ADD, &ast->binary);
        case MOJOSHADER_AST_OP_SUBASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_SUBTRACT, &ast->binary);
        case MOJOSHADER_AST_OP_LSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_LSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_RSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_RSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_ANDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_AND, &ast->binary);
        case MOJOSHADER_AST_OP_XORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_XOR, &ast->binary);
        case MOJOSHADER_AST_OP_ORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_OR, &ast->binary);

        case MOJOSHADER_AST_OP_CONDITIONAL:
            assert(ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return build_ir_compare(ctx, MOJOSHADER_IR_COND_EQL,
                                  build_ir_expr(ctx, ast->ternary.left),
                                  new_ir_constbool(ctx, 1),
                                  build_ir_expr(ctx, ast->ternary.center),
                                  build_ir_expr(ctx, ast->ternary.right));

        case MOJOSHADER_AST_OP_IDENTIFIER:
            return build_ir_identifier(ctx, &ast->identifier);

        case MOJOSHADER_AST_OP_INT_LITERAL:
            return new_ir_constint(ctx, ast->intliteral.value);

        case MOJOSHADER_AST_OP_FLOAT_LITERAL:
            return new_ir_constfloat(ctx, ast->floatliteral.value);

        case MOJOSHADER_AST_OP_BOOLEAN_LITERAL:
            return new_ir_constbool(ctx, ast->boolliteral.value);

        case MOJOSHADER_AST_OP_CALLFUNC:
            return build_ir_call(ctx, &ast->callfunc);

        case MOJOSHADER_AST_OP_CONSTRUCTOR:
            return build_ir_constructor(ctx, &ast->constructor);

        case MOJOSHADER_AST_OP_CAST:
            return build_ir_convert(ctx, &ast->cast);

        case MOJOSHADER_AST_STATEMENT_BREAK:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->end);
        } // case

        case MOJOSHADER_AST_STATEMENT_CONTINUE:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->start);
        } // case

        case MOJOSHADER_AST_STATEMENT_DISCARD:
            return new_ir_seq(ctx, new_ir_discard(ctx), build_ir_stmt(ctx, ast->discardstmt.next));

        case MOJOSHADER_AST_STATEMENT_EMPTY:
            return build_ir(ctx, ast->stmt.next);  // skip it, do next thing.

        case MOJOSHADER_AST_STATEMENT_EXPRESSION:
            return new_ir_seq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->exprstmt.expr)), build_ir_stmt(ctx, ast->exprstmt.next));

        case MOJOSHADER_AST_STATEMENT_IF:
            return build_ir_ifstmt(ctx, &ast->ifstmt);

        case MOJOSHADER_AST_STATEMENT_TYPEDEF:  // ignore this, move on.
            return build_ir(ctx, ast->typedefstmt.next);

        case MOJOSHADER_AST_STATEMENT_SWITCH:
            return build_ir_switch(ctx, &ast->switchstmt);

        case MOJOSHADER_AST_STATEMENT_STRUCT:  // ignore this, move on.
            return build_ir(ctx, ast->structstmt.next);

        case MOJOSHADER_AST_STATEMENT_VARDECL: // ignore this, move on.
            return build_ir(ctx, ast->vardeclstmt.next);

        case MOJOSHADER_AST_STATEMENT_BLOCK:
            return new_ir_seq(ctx, build_ir_stmt(ctx, ast->blockstmt.statements), build_ir_stmt(ctx, ast->blockstmt.next));

        case MOJOSHADER_AST_STATEMENT_FOR:
            return build_ir_forstmt(ctx, &ast->forstmt);

        case MOJOSHADER_AST_STATEMENT_DO:
            return build_ir_dostmt(ctx, &ast->dostmt);

        case MOJOSHADER_AST_STATEMENT_WHILE:
            return build_ir_whilestmt(ctx, &ast->whilestmt);

        case MOJOSHADER_AST_STATEMENT_RETURN:
        {
            const int label = ctx->ir_end;
            assert(label >= 0);  // parser should have caught this!
            MOJOSHADER_irStatement *retval = NULL;
            if (ast->returnstmt.expr != NULL)
            {
                // !!! FIXME: whole array/struct returns need to move more into the temp.
                const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->returnstmt.expr->datatype);
                const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
                const int elems = datatype_elems(ctx, dt);
                assert(ctx->ir_ret >= 0);
                retval = new_ir_move(ctx, new_ir_temp(ctx, ctx->ir_ret, type, elems), build_ir_expr(ctx, ast->returnstmt.expr), -1);
            } // if
            return new_ir_seq(ctx, retval, new_ir_jump(ctx, label));
        } // case

        case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
        case MOJOSHADER_AST_COMPUNIT_STRUCT:
        case MOJOSHADER_AST_COMPUNIT_VARIABLE:
        case MOJOSHADER_AST_COMPUNIT_FUNCTION:
        case MOJOSHADER_AST_ARGUMENTS:
        case MOJOSHADER_AST_OP_STRING_LITERAL:
        case MOJOSHADER_AST_SWITCH_CASE:
        case MOJOSHADER_AST_SCALAR_OR_ARRAY:
        case MOJOSHADER_AST_TYPEDEF:
        case MOJOSHADER_AST_FUNCTION_PARAMS:
        case MOJOSHADER_AST_FUNCTION_SIGNATURE:
        case MOJOSHADER_AST_STRUCT_DECLARATION:
        case MOJOSHADER_AST_STRUCT_MEMBER:
        case MOJOSHADER_AST_VARIABLE_DECLARATION:
        case MOJOSHADER_AST_ANNOTATION:
        case MOJOSHADER_AST_PACK_OFFSET:
        case MOJOSHADER_AST_VARIABLE_LOWLEVEL:
            assert(0 && "Shouldn't hit this in build_ir.");
            return NULL;

        default:
            assert(0 && "unexpected type");
            return NULL;
    } // switch
}